

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_math.cxx
# Opt level: O0

void ndiTransformToMatrixfd(float *trans,double *matrix)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  double dVar17;
  double dVar18;
  double f;
  double rr;
  double ss;
  double yz;
  double xz;
  double xy;
  double wz;
  double wy;
  double wx;
  double zz;
  double yy;
  double xx;
  double ww;
  double *matrix_local;
  float *trans_local;
  
  fVar1 = trans[2];
  fVar2 = trans[2];
  fVar3 = trans[3];
  fVar4 = trans[3];
  fVar5 = *trans;
  fVar6 = trans[1];
  fVar7 = *trans;
  fVar8 = trans[2];
  fVar9 = *trans;
  fVar10 = trans[3];
  fVar11 = trans[1];
  fVar12 = trans[2];
  fVar13 = trans[1];
  fVar14 = trans[3];
  fVar15 = trans[2];
  fVar16 = trans[3];
  dVar17 = (double)(trans[1] * trans[1]) + (double)(fVar1 * fVar2) + (double)(fVar3 * fVar4);
  dVar18 = ((double)(*trans * *trans) - dVar17) * 0.5;
  dVar17 = 2.0 / ((double)(*trans * *trans) + dVar17);
  *matrix = (dVar18 + (double)(trans[1] * trans[1])) * dVar17;
  matrix[1] = ((double)(fVar9 * fVar10) + (double)(fVar11 * fVar12)) * dVar17;
  matrix[2] = (-(double)(fVar7 * fVar8) + (double)(fVar13 * fVar14)) * dVar17;
  matrix[3] = 0.0;
  matrix[4] = (-(double)(fVar9 * fVar10) + (double)(fVar11 * fVar12)) * dVar17;
  matrix[5] = (dVar18 + (double)(fVar1 * fVar2)) * dVar17;
  matrix[6] = ((double)(fVar5 * fVar6) + (double)(fVar15 * fVar16)) * dVar17;
  matrix[7] = 0.0;
  matrix[8] = ((double)(fVar7 * fVar8) + (double)(fVar13 * fVar14)) * dVar17;
  matrix[9] = (-(double)(fVar5 * fVar6) + (double)(fVar15 * fVar16)) * dVar17;
  matrix[10] = (dVar18 + (double)(fVar3 * fVar4)) * dVar17;
  matrix[0xb] = 0.0;
  matrix[0xc] = (double)trans[4];
  matrix[0xd] = (double)trans[5];
  matrix[0xe] = (double)trans[6];
  matrix[0xf] = 1.0;
  return;
}

Assistant:

ndicapiExport void ndiTransformToMatrixfd(const float trans[8], double matrix[16])
{
  double ww, xx, yy, zz, wx, wy, wz, xy, xz, yz, ss, rr, f;

  /* Determine some calculations done more than once. */
  ww = trans[0] * trans[0];
  xx = trans[1] * trans[1];
  yy = trans[2] * trans[2];
  zz = trans[3] * trans[3];
  wx = trans[0] * trans[1];
  wy = trans[0] * trans[2];
  wz = trans[0] * trans[3];
  xy = trans[1] * trans[2];
  xz = trans[1] * trans[3];
  yz = trans[2] * trans[3];

  rr = xx + yy + zz;
  ss = (ww - rr) * 0.5;
  /* Normalization factor */
  f = 2.0 / (ww + rr);

  /* Fill in the matrix. */
  matrix[0]  = (ss + xx) * f;
  matrix[1]  = (wz + xy) * f;
  matrix[2]  = (-wy + xz) * f;
  matrix[3]  = 0;
  matrix[4]  = (-wz + xy) * f;
  matrix[5]  = (ss + yy) * f;
  matrix[6]  = (wx + yz) * f;
  matrix[7]  = 0;
  matrix[8]  = (wy + xz) * f;
  matrix[9]  = (-wx + yz) * f;
  matrix[10] = (ss + zz) * f;
  matrix[11] = 0;
  matrix[12] = trans[4];
  matrix[13] = trans[5];
  matrix[14] = trans[6];
  matrix[15] = 1;
}